

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.h
# Opt level: O0

double brotli::ShannonEntropy(uint32_t *population,size_t size,size_t *total)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t p;
  uint32_t *population_end;
  double retval;
  size_t sum;
  size_t *total_local;
  size_t size_local;
  uint32_t *population_local;
  
  retval = 0.0;
  population_end = (uint32_t *)0x0;
  size_local = (size_t)population;
  if ((size & 1) != 0) goto LAB_001fa414;
  while (size_local < population + size) {
    uVar1 = *(uint *)size_local;
    uVar2 = CONCAT44(0,uVar1);
    retval = (double)((long)retval + uVar2);
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = 0x45300000;
    dVar3 = FastLog2(uVar2);
    population_end =
         (uint32_t *)
         (-((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * dVar3 +
         (double)population_end);
    size_local = size_local + 4;
LAB_001fa414:
    uVar1 = *(uint *)size_local;
    uVar2 = CONCAT44(0,uVar1);
    retval = (double)((long)retval + uVar2);
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar3 = FastLog2(uVar2);
    population_end =
         (uint32_t *)
         (-((auVar5._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * dVar3 +
         (double)population_end);
    size_local = size_local + 4;
  }
  if (retval != 0.0) {
    auVar6._8_4_ = (int)((ulong)retval >> 0x20);
    auVar6._0_8_ = retval;
    auVar6._12_4_ = 0x45300000;
    dVar3 = FastLog2((size_t)retval);
    population_end =
         (uint32_t *)
         (((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0)) * dVar3 +
         (double)population_end);
  }
  *total = (size_t)retval;
  return (double)population_end;
}

Assistant:

static inline double ShannonEntropy(const uint32_t *population, size_t size,
                                    size_t *total) {
  size_t sum = 0;
  double retval = 0;
  const uint32_t *population_end = population + size;
  size_t p;
  if (size & 1) {
    goto odd_number_of_elements_left;
  }
  while (population < population_end) {
    p = *population++;
    sum += p;
    retval -= static_cast<double>(p) * FastLog2(p);
 odd_number_of_elements_left:
    p = *population++;
    sum += p;
    retval -= static_cast<double>(p) * FastLog2(p);
  }
  if (sum) retval += static_cast<double>(sum) * FastLog2(sum);
  *total = sum;
  return retval;
}